

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::async_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_function *tfunction)

{
  t_type *ttype;
  t_struct *ptVar1;
  t_struct *ptVar2;
  int iVar3;
  char *pcVar4;
  string *this_00;
  string response_param;
  allocator local_172;
  allocator local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ttype = tfunction->returntype_;
  ptVar1 = tfunction->arglist_;
  if (this->gen_cocoa_ == true) {
    function_name_abi_cxx11_(&local_150,this,tfunction);
  }
  else {
    std::__cxx11::string::string((string *)&local_150,(string *)&tfunction->name_);
  }
  std::operator+(__return_storage_ptr__,"func ",&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (this->gen_cocoa_ == false) {
    std::__cxx11::string::string((string *)&local_150,"(Result<",(allocator *)&local_170);
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
    if ((char)iVar3 == '\0') {
      type_name_abi_cxx11_(&local_170,this,ttype,false,false);
    }
    else {
      std::__cxx11::string::string((string *)&local_170,"Void",(allocator *)&local_90);
    }
    std::__cxx11::string::append((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::append((char *)&local_150);
    ptVar2 = tfunction->arglist_;
    std::__cxx11::string::string((string *)&local_50,"",&local_172);
    argument_list(&local_110,this,ptVar2,&local_50,false);
    std::operator+(&local_f0,"(",&local_110);
    pcVar4 = ", ";
    if ((ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar4 = "";
    }
    std::operator+(&local_d0,&local_f0,pcVar4);
    std::operator+(&local_b0,&local_d0,"completion: @escaping ");
    std::operator+(&local_130,&local_b0,&local_150);
    std::operator+(&local_170,&local_130,")");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    this_00 = &local_50;
  }
  else {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
    if ((char)iVar3 == '\0') {
      type_name_abi_cxx11_(&local_130,this,ttype,false,false);
    }
    else {
      std::__cxx11::string::string((string *)&local_130,"",&local_172);
    }
    std::operator+(&local_170,"(",&local_130);
    std::operator+(&local_150,&local_170,") -> Void");
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    ptVar2 = tfunction->arglist_;
    std::__cxx11::string::string((string *)&local_70,"",&local_171);
    argument_list(&local_90,this,ptVar2,&local_70,false);
    std::operator+(&local_110,"(",&local_90);
    pcVar4 = ", ";
    if ((ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar4 = "";
    }
    std::operator+(&local_f0,&local_110,pcVar4);
    std::operator+(&local_d0,&local_f0,"success: ");
    std::operator+(&local_b0,&local_d0,&local_150);
    std::operator+(&local_130,&local_b0,", ");
    std::operator+(&local_170,&local_130,"failure: (NSError) -> Void) throws");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_150);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::async_function_signature(t_function* tfunction) {
  t_type* ttype = tfunction->get_returntype();
  t_struct* targlist = tfunction->get_arglist();
  string result = "func " + (gen_cocoa_ ? function_name(tfunction) : tfunction->get_name());

  if (!gen_cocoa_) {
    string response_string = "(Result<";
    response_string += (ttype->is_void()) ? "Void" : type_name(ttype);
    response_string += ", Error>) -> Void";
    result += "(" + argument_list(tfunction->get_arglist(), "", false)
            + (targlist->get_members().size() ? ", " : "")
            + "completion: @escaping " + response_string + ")";
  } else {
    string response_param = "(" + ((ttype->is_void()) ? "" : type_name(ttype)) + ") -> Void";
    result += "(" + argument_list(tfunction->get_arglist(), "", false)
            + (targlist->get_members().size() ? ", " : "")
            + "success: " + response_param + ", "
            + "failure: (NSError) -> Void) throws";
  }
  return result;
}